

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O3

void beltWBLStepD2(void *buf1,void *buf2,size_t count,void *state)

{
  long *src;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = count + 0xf >> 3 & 0x1ffffffffffffffe;
  *(ulong *)((long)state + 0x40) = uVar2;
  if (uVar2 != 0) {
    src = (long *)((long)state + 0x40);
    do {
      *(undefined8 *)((long)state + 0x20) = *buf2;
      *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf2 + 8);
      memCopy(buf2,(void *)((long)buf1 + (count - 0x20)),0x10);
      memMove((void *)((long)buf1 + 0x10),buf1,count - 0x20);
      *(undefined8 *)buf1 = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)((long)buf1 + 8) = *(undefined8 *)((long)state + 0x28);
      beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
      lVar5 = 0x10;
      memXor2((octet *)((long)state + 0x20),src,8);
      *(ulong *)buf2 = *buf2 ^ *(ulong *)((long)state + 0x20);
      *(ulong *)((long)buf2 + 8) = *(ulong *)((long)buf2 + 8) ^ *(ulong *)((long)state + 0x28);
      uVar2 = 0x30;
      if (0x30 < count) {
        uVar1 = *buf1;
        uVar3 = *(ulong *)((long)buf1 + 8);
        do {
          uVar4 = uVar2;
          uVar1 = uVar1 ^ *(ulong *)((long)buf1 + (uVar4 - 0x20));
          *(ulong *)buf1 = uVar1;
          uVar3 = uVar3 ^ *(ulong *)((long)buf1 + (uVar4 - 0x18));
          *(ulong *)((long)buf1 + 8) = uVar3;
          uVar2 = uVar4 + 0x10;
        } while (uVar2 < count);
        lVar5 = uVar4 - 0x10;
      }
      if (lVar5 + 0x10U < count) {
        memXor2(buf1,(void *)((long)buf1 + lVar5),(count - 0x10) - lVar5);
        memXor2((void *)((long)buf1 + ((count - 0x10) - lVar5)),buf2,uVar2 - count);
      }
      *src = *src + -1;
    } while (*src != 0);
  }
  return;
}

Assistant:

void beltWBLStepD2(void* buf1, void* buf2, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	// pre
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint3(buf1, count - 16, buf2, 16, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, buf2);
		// r <- ShHi^128(r)
		memCopy(buf2, (octet*)buf1 + count - 32, 16);
		memMove((octet*)buf1 + 16, buf1, count - 32);
		// r1 <- block
		beltBlockCopy(buf1, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2(buf2, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 32 < count; i += 16)
			beltBlockXor2(buf1, (octet*)buf1 + i);
		ASSERT(i + 16 <= count && i + 32 >= count);
		if (i + 16 < count)
		{
			memXor2(buf1, (octet*)buf1 + i, count - 16 - i);
			memXor2((octet*)buf1 + count - 16 - i, buf2, 32 + i - count);
		}
	}
}